

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::ES5ArrayTypeHandlerBase<int>::ES5ArrayTypeHandlerBase
          (ES5ArrayTypeHandlerBase<int> *this,Recycler *recycler)

{
  Recycler *pRVar1;
  IndexPropertyDescriptorMap *this_00;
  TrackAllocData local_40;
  Recycler *local_18;
  Recycler *recycler_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  local_18 = recycler;
  recycler_local = (Recycler *)this;
  DictionaryTypeHandlerBase<int>::DictionaryTypeHandlerBase
            (&this->super_DictionaryTypeHandlerBase<int>,recycler);
  (this->super_DictionaryTypeHandlerBase<int>).super_DynamicTypeHandler._vptr_DynamicTypeHandler =
       (_func_int **)&PTR_GetCppName_01e471e8;
  Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::WriteBarrierPtr(&this->indexPropertyMap);
  pRVar1 = local_18;
  this->dataItemAttributes = '\a';
  this->lengthWritable = true;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&IndexPropertyDescriptorMap::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
             ,0xdf);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_40);
  this_00 = (IndexPropertyDescriptorMap *)new<Memory::Recycler>(0x20,pRVar1,0x43c4b0);
  IndexPropertyDescriptorMap::IndexPropertyDescriptorMap(this_00,local_18);
  Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator=
            (&this->indexPropertyMap,this_00);
  return;
}

Assistant:

ES5ArrayTypeHandlerBase<T>::ES5ArrayTypeHandlerBase(Recycler* recycler)
        : DictionaryTypeHandlerBase<T>(recycler), dataItemAttributes(PropertyDynamicTypeDefaults), lengthWritable(true)
    {
        indexPropertyMap = RecyclerNew(recycler, IndexPropertyDescriptorMap, recycler);
    }